

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

void helicsFilterSetOption(HelicsFilter filt,int option,int value,HelicsError *err)

{
  FilterObject *pFVar1;
  uint in_EDX;
  uint in_ESI;
  FilterObject *filtObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsFilter in_stack_ffffffffffffffd8;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilterObj
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pFVar1 != (FilterObject *)0x0) {
    (*(pFVar1->filtPtr->super_Interface)._vptr_Interface[2])
              (pFVar1->filtPtr,(ulong)in_ESI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void helicsFilterSetOption(HelicsFilter filt, int option, int value, HelicsError* err)
{
    auto* filtObj = getFilterObj(filt, err);
    if (filtObj == nullptr) {
        return;
    }
    try {
        filtObj->filtPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}